

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_hash.h
# Opt level: O1

void duckdb_brotli::InitializeH5(HasherCommon *common,H5 *self,BrotliEncoderParams *params)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint32_t *puVar4;
  size_t sVar5;
  
  self->common_ = common;
  iVar1 = (common->params).bucket_bits;
  self->hash_shift_ = 0x20 - iVar1;
  self->bucket_size_ = 1L << ((byte)iVar1 & 0x3f);
  puVar4 = (uint32_t *)common->extra[1];
  self->num_ = (uint16_t *)common->extra[0];
  self->buckets_ = puVar4;
  uVar2 = (common->params).block_bits;
  uVar3 = (common->params).num_last_distances_to_check;
  sVar5 = 1L << ((byte)uVar2 & 0x3f);
  self->block_size_ = sVar5;
  self->block_mask_ = (int)sVar5 - 1;
  self->block_bits_ = uVar2;
  self->num_last_distances_to_check_ = uVar3;
  return;
}

Assistant:

static void FN(Initialize)(
    HasherCommon* common, HashLongestMatch* BROTLI_RESTRICT self,
    const BrotliEncoderParams* params) {
  self->common_ = common;

  BROTLI_UNUSED(params);
  self->hash_shift_ = 32 - common->params.bucket_bits;
  self->bucket_size_ = (size_t)1 << common->params.bucket_bits;
  self->block_size_ = (size_t)1 << common->params.block_bits;
  self->block_mask_ = (uint32_t)(self->block_size_ - 1);
  self->num_ = (uint16_t*)common->extra[0];
  self->buckets_ = (uint32_t*)common->extra[1];
  self->block_bits_ = common->params.block_bits;
  self->num_last_distances_to_check_ =
      common->params.num_last_distances_to_check;
}